

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall QFileDialogPrivate::retranslateWindowTitle(QFileDialogPrivate *this)

{
  bool bVar1;
  QWidget *this_00;
  long lVar2;
  QArrayData *pQVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  byte bVar6;
  int iVar7;
  long in_FS_OFFSET;
  QStringView QVar8;
  QStringView QVar9;
  QString local_68;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  bVar1 = this->useDefaultCaption;
  bVar6 = 1;
  if (bVar1 == true) {
    QWidget::windowTitle(&local_48,this_00);
    lVar2 = (this->setWindowTitle).d.size;
    if (lVar2 == local_48.d.size) {
      QVar8.m_data = (this->setWindowTitle).d.ptr;
      QVar8.m_size = lVar2;
      QVar9.m_data = local_48.d.ptr;
      QVar9.m_size = local_48.d.size;
      bVar6 = QtPrivate::equalStrings(QVar8,QVar9);
      bVar6 = bVar6 ^ 1;
    }
  }
  if ((bVar1 != false) && (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0)) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (bVar6 == 0) {
    iVar7 = QFileDialogOptions::acceptMode();
    if (iVar7 == 0) {
      iVar7 = QFileDialogOptions::fileMode();
      if (iVar7 == 2) {
        iVar7 = 0x6f49d6;
      }
      else {
        iVar7 = 0x6f49ee;
      }
    }
    else {
      iVar7 = 0x6f49e5;
    }
    QMetaObject::tr((char *)&local_68,(char *)&QFileDialog::staticMetaObject,iVar7);
    QWidget::setWindowTitle(this_00,&local_68);
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
    QWidget::windowTitle(&local_68,this_00);
    pQVar3 = &((this->setWindowTitle).d.d)->super_QArrayData;
    pcVar4 = (this->setWindowTitle).d.ptr;
    (this->setWindowTitle).d.d = local_68.d.d;
    (this->setWindowTitle).d.ptr = local_68.d.ptr;
    qVar5 = (this->setWindowTitle).d.size;
    (this->setWindowTitle).d.size = local_68.d.size;
    local_68.d.d = (Data *)pQVar3;
    local_68.d.ptr = pcVar4;
    local_68.d.size = qVar5;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::retranslateWindowTitle()
{
    Q_Q(QFileDialog);
    if (!useDefaultCaption || setWindowTitle != q->windowTitle())
        return;
    if (q->acceptMode() == QFileDialog::AcceptOpen) {
        const QFileDialog::FileMode fileMode = q->fileMode();
        if (fileMode == QFileDialog::Directory)
            q->setWindowTitle(QFileDialog::tr("Find Directory"));
        else
            q->setWindowTitle(QFileDialog::tr("Open"));
    } else
        q->setWindowTitle(QFileDialog::tr("Save As"));

    setWindowTitle = q->windowTitle();
}